

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# components.hpp
# Opt level: O0

void __thiscall cs::forward_exception::~forward_exception(forward_exception *this)

{
  forward_exception *in_RDI;
  
  ~forward_exception(in_RDI);
  operator_delete(in_RDI,0x28);
  return;
}

Assistant:

~forward_exception() override = default;